

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::SamplesMissMatchTest::SamplesMissMatchTest
          (SamplesMissMatchTest *this,Context *context)

{
  pointer *pptVar1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  iterator __position;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  bool bVar10;
  GLenum GVar11;
  testCase local_4c;
  vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
  *local_38;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"samples_missmatch",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData have different number of samples"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplesMissMatchTest_020c3938;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  local_38 = (vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
              *)&this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 0;
  bVar8 = true;
  do {
    bVar7 = bVar8;
    iVar2 = SamplesMissMatchTest::n_samples[lVar9];
    lVar9 = 0;
    bVar8 = true;
    do {
      bVar5 = bVar8;
      iVar3 = SamplesMissMatchTest::n_samples[lVar9];
      GVar11 = 0x502;
      if (iVar2 == iVar3) {
        GVar11 = 0;
      }
      lVar9 = 0;
      bVar8 = true;
      do {
        bVar6 = bVar8;
        GVar4 = SamplesMissMatchTest::targets[lVar9];
        lVar9 = 0;
        bVar8 = true;
        do {
          bVar10 = bVar8;
          local_4c.m_dst_target = SamplesMissMatchTest::targets[lVar9];
          __position._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_4c.m_src_target = GVar4;
            local_4c.m_src_n_samples = iVar2;
            local_4c.m_dst_n_samples = iVar3;
            local_4c.m_expected_result = GVar11;
            std::
            vector<gl4cts::CopyImage::SamplesMissMatchTest::testCase,std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>>
            ::_M_realloc_insert<gl4cts::CopyImage::SamplesMissMatchTest::testCase_const&>
                      (local_38,__position,&local_4c);
          }
          else {
            (__position._M_current)->m_expected_result = GVar11;
            (__position._M_current)->m_src_target = GVar4;
            (__position._M_current)->m_src_n_samples = iVar2;
            (__position._M_current)->m_dst_target = local_4c.m_dst_target;
            (__position._M_current)->m_dst_n_samples = iVar3;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::CopyImage::SamplesMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::SamplesMissMatchTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          lVar9 = 1;
          bVar8 = false;
        } while (bVar10);
        bVar8 = false;
      } while (bVar6);
    } while (bVar5);
  } while (bVar7);
  return;
}

Assistant:

SamplesMissMatchTest::SamplesMissMatchTest(deqp::Context& context)
	: TestCase(context, "samples_missmatch", "Test verifies if INVALID_OPERATION is generated when textures provided "
											 "to CopySubImageData have different number of samples")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	testCase test_case;

	static const GLsizei n_samples[2] = { 1, 4 };

	static const GLenum targets[2] = { GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	for (GLuint src_sample = 0; src_sample < 2; ++src_sample)
	{
		for (GLuint dst_sample = 0; dst_sample < 2; ++dst_sample)
		{
			for (GLuint src_target = 0; src_target < 2; ++src_target)
			{
				for (GLuint dst_target = 0; dst_target < 2; ++dst_target)
				{
					test_case.m_src_target	= targets[src_target];
					test_case.m_src_n_samples = n_samples[src_sample];
					test_case.m_dst_target	= targets[dst_target];
					test_case.m_dst_n_samples = n_samples[dst_sample];

					if (test_case.m_src_n_samples == test_case.m_dst_n_samples)
					{
						test_case.m_expected_result = GL_NO_ERROR;
					}
					else
					{
						test_case.m_expected_result = GL_INVALID_OPERATION;
					}

					m_test_cases.push_back(test_case);
				}
			}
		}
	}
}